

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

void __thiscall
capnp::
CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
::setPipeline(CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
              *this,Pipeline *pipeline)

{
  CallContextHook *pCVar1;
  Own<capnp::PipelineHook,_std::nullptr_t> local_18;
  
  pCVar1 = this->hook;
  local_18.disposer._0_4_ = *(undefined4 *)&(pipeline->_typeless).hook.disposer;
  local_18.disposer._4_4_ = *(undefined4 *)((long)&(pipeline->_typeless).hook.disposer + 4);
  local_18.ptr._0_4_ = *(undefined4 *)&(pipeline->_typeless).hook.ptr;
  local_18.ptr._4_4_ = *(undefined4 *)((long)&(pipeline->_typeless).hook.ptr + 4);
  (pipeline->_typeless).hook.ptr = (PipelineHook *)0x0;
  (*pCVar1->_vptr_CallContextHook[4])(pCVar1,&local_18);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_18);
  return;
}

Assistant:

void CallContext<Params, Results>::setPipeline(typename Results::Pipeline&& pipeline) {
  hook->setPipeline(PipelineHook::from(kj::mv(pipeline)));
}